

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O2

void __thiscall
cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::deallocate
          (MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *this,void *ptr,
          size_type size)

{
  MemChunk *this_00;
  size_type sVar1;
  undefined4 *puVar2;
  byte bVar3;
  long lVar4;
  char *pcVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (ptr == (void *)0x0) {
    return;
  }
  if ((*(ulong *)((long)ptr + -8) & 1) == 0) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(0x10);
    *puVar2 = 2;
    pcVar5 = "potentially freeing an unused pointer";
  }
  else {
    this_00 = (MemChunk *)((long)ptr + -0x10);
    uVar8 = *(ulong *)((long)ptr + -8) & 0xfffffffffffffff0;
    if (this->m_padding != true) {
LAB_00103089:
      MemChunk::getUserSize(this_00);
      *(ulong *)((long)ptr + -8) = uVar8;
      *(ulong *)((long)ptr + (uVar8 - 0x10)) = uVar8;
      addChunk(this,this_00);
      return;
    }
    if (0x10 < uVar8) {
      sVar1 = MemChunk::getUserSize(this_00);
      uVar7 = sVar1 + 0x10;
      lVar4 = uVar8 - uVar7;
      if ((((uVar7 <= uVar8 && lVar4 != 0) && (bVar3 = (byte)lVar4, '\0' < (char)bVar3)) &&
          (((uint)lVar4 & 0x7f) + uVar7 == uVar8)) &&
         (*(byte *)((long)ptr + (uVar8 - 0x11)) == bVar3)) {
        bVar6 = 9;
        if (bVar3 < 9) {
          bVar6 = bVar3;
        }
        uVar7 = 0;
        do {
          if ((byte)(bVar6 - 1) == uVar7) goto LAB_00103089;
          lVar4 = uVar7 + sVar1;
          uVar7 = uVar7 + 1;
        } while (*(char *)((long)ptr + lVar4) == this->m_paddingByte);
        puVar2 = (undefined4 *)__cxa_allocate_exception(0x10);
        *puVar2 = 3;
        pcVar5 = "padding byte got modified.";
        goto LAB_00103074;
      }
    }
    puVar2 = (undefined4 *)__cxa_allocate_exception(0x10);
    *puVar2 = 1;
    pcVar5 = "assertion failure.";
  }
LAB_00103074:
  *(char **)(puVar2 + 2) = pcVar5;
  __cxa_throw(puVar2,&Exception::typeinfo,0);
}

Assistant:

void
    deallocate (T* ptr, size_type size = 0)
    {
        if (ptr != nullptr)
        {
            MemChunk* chunk = mem2Chunk (ptr);
            if (!chunk->isUsed())
            {
                throw Exception (MEM_ERROR_DOUBLE_FREE, "potentially freeing an unused pointer");
            }
            size_type chunkSize = chunk->getChunkSize ();
            if (m_padding)
            {
                COOKMEM_ASSERT (chunkSize > CHUNK_OVERHEAD);
                size_type userSize = chunk->getUserSize () + CHUNK_OVERHEAD;
                COOKMEM_ASSERT (userSize < chunkSize);
                char diff = (char)(chunkSize - userSize);
                COOKMEM_ASSERT ((diff > 0) && ((userSize + diff) == chunkSize));
                COOKMEM_ASSERT (*(((char*)chunk) + chunkSize - 1) == diff);

                char* paddingPtr = ((char*)chunk) + userSize;
                --diff;
                if (diff > 8)
                {
                    diff = 8;
                }
                for (int i = 0; i < diff; ++i)
                {
                    if (paddingPtr[i] != m_paddingByte)
                    {
                        throw Exception (MEM_ERROR_PADDING, "padding byte got modified.");
                    }
                }
            }
            m_logger.logDeallocation (ptr, chunk->getUserSize ());

            chunk->setFreeChunkSize (chunkSize);
            addChunk (chunk);
        }
        else
        {
            m_logger.logDeallocation (ptr, size);
        }
    }